

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O3

bool __thiscall
glcts::ShaderBitfieldOperationCaseUnaryInt::test
          (ShaderBitfieldOperationCaseUnaryInt *this,Data *data)

{
  GLint GVar1;
  long lVar2;
  bool bVar3;
  
  if (this->m_components < 1) {
    return true;
  }
  lVar2 = 0;
  do {
    GVar1 = (*this->m_func)(data->inIvec4[lVar2]);
    bVar3 = data->outIvec4[lVar2] == GVar1;
    if (!bVar3) {
      return bVar3;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 < this->m_components);
  return bVar3;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLint expected = m_func(data->inIvec4[i]);
			if (data->outIvec4[i] != expected)
			{
				return false;
			}
		}
		return true;
	}